

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256.cpp
# Opt level: O2

void duckdb::Node256::Free(ART *art,Node *node)

{
  Node256 *pNVar1;
  long lVar2;
  
  pNVar1 = Node::Ref<duckdb::Node256>(art,(Node)(node->super_IndexPointer).data,NODE_256);
  if (pNVar1->count != 0) {
    for (lVar2 = 0; lVar2 != 0x800; lVar2 = lVar2 + 8) {
      if (*(char *)((long)&pNVar1->children[0].super_IndexPointer.data + lVar2 + 7) != '\0') {
        Node::Free(art,(Node *)((long)&pNVar1->children[0].super_IndexPointer.data + lVar2));
      }
    }
  }
  return;
}

Assistant:

void Node256::Free(ART &art, Node &node) {
	auto &n256 = Node::Ref<Node256>(art, node, NODE_256);
	if (!n256.count) {
		return;
	}

	Iterator(n256, [&](Node &child) { Node::Free(art, child); });
}